

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_mp3_init(ma_read_proc onRead,ma_seek_proc onSeek,ma_tell_proc onTell,
                     void *pReadSeekTellUserData,ma_decoding_backend_config *pConfig,
                     ma_allocation_callbacks *pAllocationCallbacks,ma_mp3 *pMP3)

{
  ma_bool32 mVar1;
  ma_dr_mp3 *in_RCX;
  undefined8 in_RDX;
  long in_RSI;
  long in_RDI;
  ma_mp3 *in_R8;
  ma_mp3 *in_R9;
  ma_bool32 mp3Result;
  ma_result result;
  ma_allocation_callbacks *in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffc0;
  undefined4 local_4;
  
  local_4 = ma_mp3_init_internal((ma_decoding_backend_config *)in_RCX,in_R8);
  if (local_4 == MA_SUCCESS) {
    if ((in_RDI == 0) || (in_RSI == 0)) {
      local_4 = MA_INVALID_ARGS;
    }
    else {
      *(long *)(_mp3Result + 0x48) = in_RDI;
      *(long *)(_mp3Result + 0x50) = in_RSI;
      *(undefined8 *)(_mp3Result + 0x58) = in_RDX;
      *(ma_dr_mp3 **)(_mp3Result + 0x60) = in_RCX;
      mVar1 = ma_dr_mp3_init(in_RCX,(ma_dr_mp3_read_proc)in_R8,(ma_dr_mp3_seek_proc)in_R9,
                             (void *)(ulong)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      if (mVar1 == 1) {
        ma_mp3_post_init(in_R9,(ma_decoding_backend_config *)CONCAT44(local_4,1),
                         in_stack_ffffffffffffffb8);
        local_4 = MA_SUCCESS;
      }
      else {
        local_4 = MA_INVALID_FILE;
      }
    }
  }
  return local_4;
}

Assistant:

MA_API ma_result ma_mp3_init(ma_read_proc onRead, ma_seek_proc onSeek, ma_tell_proc onTell, void* pReadSeekTellUserData, const ma_decoding_backend_config* pConfig, const ma_allocation_callbacks* pAllocationCallbacks, ma_mp3* pMP3)
{
    ma_result result;

    result = ma_mp3_init_internal(pConfig, pMP3);
    if (result != MA_SUCCESS) {
        return result;
    }

    if (onRead == NULL || onSeek == NULL) {
        return MA_INVALID_ARGS; /* onRead and onSeek are mandatory. */
    }

    pMP3->onRead = onRead;
    pMP3->onSeek = onSeek;
    pMP3->onTell = onTell;
    pMP3->pReadSeekTellUserData = pReadSeekTellUserData;

    #if !defined(MA_NO_MP3)
    {
        ma_bool32 mp3Result;

        mp3Result = ma_dr_mp3_init(&pMP3->dr, ma_mp3_dr_callback__read, ma_mp3_dr_callback__seek, pMP3, pAllocationCallbacks);
        if (mp3Result != MA_TRUE) {
            return MA_INVALID_FILE;
        }

        ma_mp3_post_init(pMP3, pConfig, pAllocationCallbacks);

        return MA_SUCCESS;
    }
    #else
    {
        /* mp3 is disabled. */
        (void)pAllocationCallbacks;
        return MA_NOT_IMPLEMENTED;
    }
    #endif
}